

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O0

void Hc4_MatchFinder_Skip(CMatchFinder *p,UInt32 num)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte *pbVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int in_ESI;
  long *in_RDI;
  UInt32 temp;
  UInt32 curMatch;
  Byte *cur;
  UInt32 hv;
  UInt32 lenLimit;
  UInt32 *hash;
  UInt32 h3;
  UInt32 h2;
  int local_c;
  
  local_c = in_ESI;
  do {
    if (*(uint *)((long)in_RDI + 0x14) < 4) {
      MatchFinder_MovePos((CMatchFinder *)0x120bca);
    }
    else {
      pbVar3 = (byte *)*in_RDI;
      uVar5 = *(uint *)((long)in_RDI + (ulong)*pbVar3 * 4 + 0x78) ^ (uint)pbVar3[1];
      uVar6 = (uint)pbVar3[2] << 8 ^ uVar5;
      uVar7 = (uVar6 ^ *(int *)((long)in_RDI + (ulong)pbVar3[3] * 4 + 0x78) << 5) &
              *(uint *)(in_RDI + 7);
      lVar4 = in_RDI[5];
      uVar1 = *(undefined4 *)(lVar4 + (ulong)(uVar7 + 0x10400) * 4);
      uVar2 = (undefined4)in_RDI[1];
      *(undefined4 *)(lVar4 + (ulong)(uVar7 + 0x10400) * 4) = uVar2;
      *(undefined4 *)(lVar4 + (ulong)((uVar6 & 0xffff) + 0x400) * 4) = uVar2;
      *(undefined4 *)(lVar4 + (ulong)(uVar5 & 0x3ff) * 4) = uVar2;
      *(undefined4 *)(in_RDI[6] + (ulong)*(uint *)(in_RDI + 3) * 4) = uVar1;
      *(int *)(in_RDI + 3) = (int)in_RDI[3] + 1;
      *in_RDI = *in_RDI + 1;
      iVar8 = (int)in_RDI[1] + 1;
      *(int *)(in_RDI + 1) = iVar8;
      if (iVar8 == *(int *)((long)in_RDI + 0xc)) {
        MatchFinder_CheckLimits((CMatchFinder *)0x120d04);
      }
    }
    local_c = local_c + -1;
  } while (local_c != 0);
  return;
}

Assistant:

static void Hc4_MatchFinder_Skip(CMatchFinder *p, UInt32 num)
{
  do
  {
    UInt32 h2, h3;
    UInt32 *hash;
    SKIP_HEADER(4)
    HASH4_CALC;
    hash = p->hash;
    curMatch = hash[kFix4HashSize + hv];
    hash[                h2] =
    hash[kFix3HashSize + h3] =
    hash[kFix4HashSize + hv] = p->pos;
    p->son[p->cyclicBufferPos] = curMatch;
    MOVE_POS
  }
  while (--num != 0);
}